

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong extraout_RDX;
  ulong uVar5;
  int iVar6;
  Curl_easy *pCVar7;
  CURLMcode CVar8;
  uint uVar9;
  ushort uVar10;
  pollfd *ufds;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  uint local_58 [6];
  int *local_40;
  long local_38;
  
  CVar8 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    local_40 = ret;
    multi_timeout(multi,&local_38);
    iVar2 = timeout_ms;
    if (local_38 < timeout_ms) {
      iVar2 = (int)local_38;
    }
    if (local_38 < 0) {
      iVar2 = timeout_ms;
    }
    pCVar7 = multi->easyp;
    iVar11 = 0;
    if (pCVar7 != (Curl_easy *)0x0) {
      uVar4 = extraout_RDX;
      iVar11 = 0;
      do {
        uVar1 = multi_getsock(pCVar7,(curl_socket_t *)local_58,(int)uVar4);
        uVar5 = 0;
        do {
          if ((uVar1 >> ((uint)uVar5 & 0x1f) & 1) == 0) {
            uVar4 = 0xffffffff;
          }
          else {
            iVar11 = iVar11 + 1;
            uVar4 = (ulong)local_58[uVar5];
          }
          if (((uVar1 >> ((byte)uVar5 & 0x1f)) >> 0x10 & 1) != 0) {
            iVar11 = iVar11 + 1;
            uVar4 = (ulong)local_58[uVar5];
          }
        } while (((int)uVar4 != -1) &&
                (uVar4 = uVar5 + 1, bVar12 = uVar5 < 4, uVar5 = uVar4, bVar12));
        pCVar7 = pCVar7->next;
      } while (pCVar7 != (Curl_easy *)0x0);
    }
    uVar4 = 0;
    if (iVar11 + extra_nfds == 0 && extra_nfds == 0) {
      auVar13 = ZEXT416(extra_nfds) << 0x40;
    }
    else {
      auVar13 = (undefined1  [16])(*Curl_cmalloc)((ulong)(iVar11 + extra_nfds) << 3);
      if (auVar13._0_8_ == 0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    uVar5 = auVar13._8_8_;
    ufds = auVar13._0_8_;
    if ((iVar11 != 0) && (pCVar7 = multi->easyp, pCVar7 != (Curl_easy *)0x0)) {
      uVar4 = 0;
      do {
        uVar1 = multi_getsock(pCVar7,(curl_socket_t *)local_58,(int)uVar5);
        uVar3 = 0;
        do {
          if ((uVar1 >> ((uint)uVar3 & 0x1f) & 1) == 0) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = (ulong)local_58[uVar3];
            ufds[uVar4].fd = local_58[uVar3];
            ufds[uVar4].events = 1;
            uVar4 = (ulong)((int)uVar4 + 1);
          }
          if (((uVar1 >> ((byte)uVar3 & 0x1f)) >> 0x10 & 1) != 0) {
            uVar5 = (ulong)local_58[uVar3];
            ufds[uVar4].fd = local_58[uVar3];
            ufds[uVar4].events = 4;
            uVar4 = (ulong)((int)uVar4 + 1);
          }
        } while (((int)uVar5 != -1) &&
                (uVar5 = uVar3 + 1, bVar12 = uVar3 < 4, uVar3 = uVar5, bVar12));
        pCVar7 = pCVar7->next;
      } while (pCVar7 != (Curl_easy *)0x0);
    }
    uVar1 = (uint)uVar4;
    if (extra_nfds != 0) {
      uVar4 = 0;
      do {
        uVar9 = uVar1 + (int)uVar4;
        ufds[uVar9].fd = extra_fds[uVar4].fd;
        uVar10 = extra_fds[uVar4].events & 1;
        ufds[uVar9].events = uVar10;
        if ((extra_fds[uVar4].events & 6U) != 0) {
          ufds[uVar9].events = uVar10 | extra_fds[uVar4].events & 6U;
        }
        uVar4 = uVar4 + 1;
      } while (extra_nfds != uVar4);
      uVar1 = uVar1 + (int)uVar4;
    }
    iVar6 = 0;
    if (uVar1 != 0) {
      iVar2 = Curl_poll(ufds,uVar1,iVar2);
      iVar6 = 0;
      if (0 < iVar2) {
        iVar6 = iVar2;
      }
      if (0 < iVar2 && extra_nfds != 0) {
        uVar4 = 0;
        do {
          extra_fds[uVar4].revents = ufds[(uint)(iVar11 + (int)uVar4)].revents & 7;
          uVar4 = uVar4 + 1;
          iVar6 = iVar2;
        } while (extra_nfds != uVar4);
      }
    }
    (*Curl_cfree)(ufds);
    CVar8 = CURLM_OK;
    if (local_40 != (int *)0x0) {
      *local_40 = iVar6;
      CVar8 = CURLM_OK;
    }
  }
  return CVar8;
}

Assistant:

CURLMcode curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;
  int retcode = 0;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);
    DEBUGF(infof(data, "Curl_poll(%d ds, %d ms) == %d\n",
                 nfds, timeout_ms, pollrc));

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  free(ufds);
  if(ret)
    *ret = retcode;
  return CURLM_OK;
}